

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void set_left_zero_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Object local_48;
  Am_Object local_40;
  int *local_38;
  am_loc_values *loc_values;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object win;
  Am_Object *cmd_local;
  
  win.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(&local_18,0xfa,0);
  local_38 = (int *)Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_18,(ulong)Am_LEFT_HOW);
  pAVar2 = Am_Object::Get(&local_40,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  *local_38 = iVar1;
  Am_Object::~Am_Object(&local_40);
  Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_18,(ulong)Am_LEFT_AMOUNT_WIDGET);
  Am_Object::Set(&local_48,0x169,0,0);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_left_zero, (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  loc_values->left_control = win.Get_Object(Am_LEFT_HOW).Get(Am_VALUE);
  win.Get_Object(Am_LEFT_AMOUNT_WIDGET).Set(Am_VALUE, 0);
}